

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
duckdb::Node::MergeIntoNode4(Node *this,ART *art,Node *l_node,Node *r_node,uint8_t pos)

{
  reference<Node> this_00;
  uint8_t uVar1;
  GateStatus status;
  undefined3 in_register_00000081;
  Node l_child;
  reference<Node> ref;
  Node local_40;
  reference<Node> local_38;
  
  local_40.super_IndexPointer.data = (IndexPointer)0;
  uVar1 = Prefix::GetByte(art,l_node,pos);
  local_38._M_data = l_node;
  status = Prefix::Split(art,&local_38,&local_40,pos);
  this_00._M_data = local_38._M_data;
  BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,local_38._M_data);
  SetGateStatus(this_00._M_data,status);
  Node4::InsertChild(art,this_00._M_data,uVar1,local_40);
  uVar1 = Prefix::GetByte(art,r_node,pos);
  Prefix::Reduce(art,r_node,(ulong)CONCAT31(in_register_00000081,pos));
  Node4::InsertChild(art,this_00._M_data,uVar1,(Node)(r_node->super_IndexPointer).data);
  (r_node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Node::MergeIntoNode4(ART &art, Node &l_node, Node &r_node, const uint8_t pos) {
	Node l_child;
	auto l_byte = Prefix::GetByte(art, l_node, pos);

	reference<Node> ref(l_node);
	auto status = Prefix::Split(art, ref, l_child, pos);
	Node4::New(art, ref);
	ref.get().SetGateStatus(status);

	Node4::InsertChild(art, ref, l_byte, l_child);

	auto r_byte = Prefix::GetByte(art, r_node, pos);
	Prefix::Reduce(art, r_node, pos);
	Node4::InsertChild(art, ref, r_byte, r_node);
	r_node.Clear();
}